

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDictionary.cpp
# Opt level: O1

bool IDictionary::isBaseType(string *str)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  iterator iVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string tempStr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  baseTypes;
  allocator_type local_1b1;
  string *local_1b0;
  size_type local_1a8;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  undefined1 *local_160 [2];
  undefined1 local_150 [16];
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 *local_120 [2];
  undefined1 local_110 [16];
  undefined1 *local_100 [2];
  undefined1 local_f0 [16];
  undefined1 *local_e0 [2];
  undefined1 local_d0 [16];
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  local_1b0 = str;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"int","");
  local_160[0] = local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_160,"float","");
  local_140[0] = local_130;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_140,"double","");
  local_120[0] = local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"short","");
  local_100[0] = local_f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"unsigned","");
  local_e0[0] = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"struct","");
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"enum","");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"char","");
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"bool","");
  __l._M_len = 9;
  __l._M_array = &local_180;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_60,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        local_1a0,&local_1b1);
  lVar9 = 0;
  do {
    if (local_70 + lVar9 != *(undefined1 **)((long)local_80 + lVar9)) {
      operator_delete(*(undefined1 **)((long)local_80 + lVar9));
    }
    lVar9 = lVar9 + -0x20;
  } while (lVar9 != -0x120);
  sVar1 = local_1b0->_M_string_length;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  pcVar2 = (local_1b0->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)&local_180,pcVar2,pcVar2 + sVar1);
  local_1a8 = sVar1;
  if (-1 < (int)sVar1) {
    uVar7 = (ulong)((int)sVar1 + 1);
    do {
      uVar7 = uVar7 - 1;
      std::__cxx11::string::substr((ulong)local_1a0,(ulong)local_1b0);
      std::__cxx11::string::operator=((string *)&local_180,(string *)local_1a0);
      if (local_1a0[0] != local_190) {
        operator_delete(local_1a0[0]);
      }
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&local_60,&local_180);
    } while (((_Rb_tree_header *)iVar4._M_node == &local_60._M_impl.super__Rb_tree_header) &&
            (uVar7 != 0));
  }
  if (local_180._M_string_length == 0) {
    bVar6 = false;
  }
  else {
    iVar5 = (uint)local_180._M_string_length + 1;
    iVar8 = (int)local_1a8;
    bVar6 = iVar8 <= iVar5;
    if (iVar5 < iVar8) {
      iVar3 = ~(uint)local_180._M_string_length + iVar8;
      lVar9 = (long)iVar5;
      do {
        uVar7 = (ulong)(byte)(local_1b0->_M_dataplus)._M_p[lVar9];
        if ((0x2a < uVar7) || ((0x40100002600U >> (uVar7 & 0x3f) & 1) == 0)) break;
        bVar6 = (long)iVar8 <= lVar9 + 1;
        iVar3 = iVar3 + -1;
        lVar9 = lVar9 + 1;
      } while (iVar3 != 0);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return bVar6;
}

Assistant:

bool IDictionary::isBaseType(std::string str) {
    std::set<std::string> baseTypes({"int","float","double","short","unsigned","struct","enum","char","bool"});
    int maxLen = str.length();
    std::string tempStr =str;

    for(int i=0;i<=maxLen;i++)
    {
        tempStr=str.substr(0,maxLen-i);
        if(baseTypes.find(tempStr)!=baseTypes.end())
            break;
    }
    if(tempStr.empty())
        return false;

    for(int i=tempStr.length()+1;i<maxLen;i++)
    {
        if(!(isBlankSep(str[i])||str[i]=='*'))
            return false;
    }
    return true;
}